

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O3

bool __thiscall
Qentem::Value<char16_t>::
CopyValueTo<Qentem::StringStream<char16_t>,void(Qentem::StringStream<char16_t>,char16_t_const*,unsigned_int)>
          (Value<char16_t> *this,StringStream<char16_t> *stream,RealFormatInfo format,
          _func_void_StringStream<char16_t>_char16_t_ptr_uint *string_function)

{
  uint uVar1;
  uint uVar2;
  SizeT SVar3;
  char16_t *to;
  Value<char16_t> *pVVar4;
  StringStream<char16_t> SVar5;
  Char_T storage [20];
  Value<char16_t> VStack_68;
  char16_t local_40 [4];
  StringStream<char16_t> local_38;
  
  for (; this->type_ == ValuePtr; this = (this->field_0).array_.storage_) {
  }
  uVar2 = 0x13416c;
  switch(this->type_) {
  case String:
    if (string_function != (_func_void_StringStream<char16_t>_char16_t_ptr_uint *)0x0) {
      StringStream<char16_t>::StringStream(&local_38,stream);
      SVar5._8_8_ = (this->field_0).array_.storage_;
      SVar5.storage_ = (char16_t *)&local_38;
      (*string_function)(SVar5,(char16_t *)(ulong)(this->field_0).array_.index_,uVar2);
      if (local_38.storage_ != (char16_t *)0x0) {
        MemoryRecord::RemoveAllocation(local_38.storage_);
      }
      operator_delete(local_38.storage_);
      return true;
    }
    pVVar4 = (this->field_0).array_.storage_;
    SVar3 = (this->field_0).array_.index_;
    uVar1 = stream->length_;
    uVar2 = uVar1 + SVar3;
    if (stream->capacity_ < uVar2) {
      StringStream<char16_t>::expand(stream,uVar2);
      uVar1 = stream->length_;
    }
    to = stream->storage_ + uVar1;
    uVar1 = SVar3 * 2;
    goto LAB_00127e85;
  case UIntLong:
    pVVar4 = (this->field_0).array_.storage_;
    break;
  case IntLong:
    pVVar4 = (this->field_0).array_.storage_;
    if ((long)pVVar4 < 0) {
      uVar2 = stream->length_;
      SVar3 = uVar2 + 1;
      if (stream->capacity_ == uVar2) {
        StringStream<char16_t>::expand(stream,SVar3);
        uVar2 = stream->length_;
      }
      pVVar4 = (Value<char16_t> *)-(long)pVVar4;
      stream->storage_[uVar2] = L'-';
      stream->length_ = SVar3;
    }
    break;
  case Double:
    Digit::realToString<double,Qentem::StringStream<char16_t>,unsigned_long_long>
              (stream,(unsigned_long_long)(this->field_0).array_.storage_,format);
    return true;
  case True:
    uVar1 = stream->length_;
    uVar2 = uVar1 + 4;
    if (stream->capacity_ < uVar2) {
      StringStream<char16_t>::expand(stream,uVar2);
      uVar1 = stream->length_;
    }
    to = stream->storage_ + uVar1;
    pVVar4 = (Value<char16_t> *)0x138c52;
    goto LAB_00127e80;
  case False:
    uVar1 = stream->length_;
    uVar2 = uVar1 + 5;
    if (stream->capacity_ < uVar2) {
      StringStream<char16_t>::expand(stream,uVar2);
      uVar1 = stream->length_;
    }
    to = stream->storage_ + uVar1;
    pVVar4 = (Value<char16_t> *)0x13ab20;
    uVar1 = 10;
    goto LAB_00127e85;
  case Null:
    uVar1 = stream->length_;
    uVar2 = uVar1 + 4;
    if (stream->capacity_ < uVar2) {
      StringStream<char16_t>::expand(stream,uVar2);
      uVar1 = stream->length_;
    }
    to = stream->storage_ + uVar1;
    pVVar4 = (Value<char16_t> *)0x134a18;
LAB_00127e80:
    uVar1 = 8;
    goto LAB_00127e85;
  default:
    return false;
  }
  SVar3 = Digit::IntToString<false,char16_t,unsigned_long_long>(local_40,(unsigned_long_long)pVVar4)
  ;
  uVar1 = stream->length_;
  uVar2 = uVar1 + SVar3;
  if (stream->capacity_ < uVar2) {
    StringStream<char16_t>::expand(stream,uVar2);
    uVar1 = stream->length_;
  }
  to = stream->storage_ + uVar1;
  uVar1 = SVar3 * 2;
  pVVar4 = (Value<char16_t> *)((long)&VStack_68.field_0 + (ulong)(0x14 - SVar3) * 2);
LAB_00127e85:
  Memory::Copy<unsigned_int>(to,pVVar4,uVar1);
  stream->length_ = uVar2;
  return true;
}

Assistant:

bool CopyValueTo(StringStream_T             &stream,
                     const Digit::RealFormatInfo format          = Digit::RealFormatInfo{Config::DoublePrecision},
                     StringFunction_T           *string_function = nullptr) const {
        switch (Type()) {
            case ValueType::String: {
                if (string_function != nullptr) {
                    string_function(stream, string_.First(), string_.Length());
                } else {
                    stream.Write(string_.First(), string_.Length());
                }

                break;
            }

            case ValueType::UIntLong: {
                Digit::NumberToString(stream, number_.Natural);
                break;
            }

            case ValueType::IntLong: {
                Digit::NumberToString(stream, number_.Integer);
                break;
            }

            case ValueType::Double: {
                Digit::NumberToString(stream, number_.Real, format);
                break;
            }

            case ValueType::True: {
                stream.Write(JSONotation::TrueString, JSONotation::TrueStringLength);
                break;
            }

            case ValueType::False: {
                stream.Write(JSONotation::FalseString, JSONotation::FalseStringLength);
                break;
            }

            case ValueType::Null: {
                stream.Write(JSONotation::NullString, JSONotation::NullStringLength);
                break;
            }

            case ValueType::ValuePtr: {
                return value_->CopyValueTo(stream, format, string_function);
            }

            default: {
                return false;
            }
        }

        return true;
    }